

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_bbdpre.c
# Opt level: O0

int ARKBBDPrecSolve(sunrealtype t,N_Vector y,N_Vector fy,N_Vector r,N_Vector z,sunrealtype gamma,
                   sunrealtype delta,int lr,void *bbd_data)

{
  int iVar1;
  undefined8 uVar2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  long in_R9;
  ARKBBDPrecData pdata;
  int retval;
  
  uVar2 = N_VGetArrayPointer(in_RDX);
  N_VSetArrayPointer(uVar2,*(undefined8 *)(in_R9 + 0x70));
  uVar2 = N_VGetArrayPointer(in_RCX);
  N_VSetArrayPointer(uVar2,*(undefined8 *)(in_R9 + 0x68));
  iVar1 = SUNLinSolSolve(0,*(undefined8 *)(in_R9 + 0x48),*(undefined8 *)(in_R9 + 0x40),
                         *(undefined8 *)(in_R9 + 0x68),*(undefined8 *)(in_R9 + 0x70));
  N_VSetArrayPointer(0,*(undefined8 *)(in_R9 + 0x70));
  N_VSetArrayPointer(0,*(undefined8 *)(in_R9 + 0x68));
  return iVar1;
}

Assistant:

static int ARKBBDPrecSolve(SUNDIALS_MAYBE_UNUSED sunrealtype t,
                           SUNDIALS_MAYBE_UNUSED N_Vector y,
                           SUNDIALS_MAYBE_UNUSED N_Vector fy, N_Vector r,
                           N_Vector z, SUNDIALS_MAYBE_UNUSED sunrealtype gamma,
                           SUNDIALS_MAYBE_UNUSED sunrealtype delta,
                           SUNDIALS_MAYBE_UNUSED int lr, void* bbd_data)
{
  int retval;
  ARKBBDPrecData pdata;

  pdata = (ARKBBDPrecData)bbd_data;

  /* Attach local data arrays for r and z to rlocal and zlocal */
  N_VSetArrayPointer(N_VGetArrayPointer(r), pdata->rlocal);
  N_VSetArrayPointer(N_VGetArrayPointer(z), pdata->zlocal);

  /* Call banded solver object to do the work */
  retval = SUNLinSolSolve(pdata->LS, pdata->savedP, pdata->zlocal,
                          pdata->rlocal, ZERO);

  /* Detach local data arrays from rlocal and zlocal */
  N_VSetArrayPointer(NULL, pdata->rlocal);
  N_VSetArrayPointer(NULL, pdata->zlocal);

  return (retval);
}